

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O0

ssize_t __thiscall slang::TimeTrace::Profiler::write(Profiler *this,int __fd,void *__buf,size_t __n)

{
  format_args args;
  string_view fmt;
  bool bVar1;
  value<fmt::v11::context> *this_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  rep durationUs;
  rep startUs;
  Entry *entry;
  iterator __end2;
  iterator __begin2;
  vector<slang::Entry,_std::allocator<slang::Entry>_> *__range2;
  anon_class_16_2_334a61d8 getTID;
  int nextThreadId;
  flat_hash_map<std::thread::id,_int> threadIdMap;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  unordered_flat_map<std::thread::id,_int,_slang::hash<std::thread::id,_void>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  *in_stack_fffffffffffffd70;
  __sv_type in_stack_fffffffffffffd90;
  id in_stack_fffffffffffffda0;
  undefined1 local_230 [32];
  native_handle_type local_210;
  int local_204;
  char *local_200;
  undefined8 local_1f8;
  string local_1f0 [32];
  duration<long,_std::ratio<1L,_1000000L>_> local_1d0;
  value<fmt::v11::context> *local_1c8;
  rep local_1c0;
  duration<long,_std::ratio<1L,_1000000L>_> local_1b8;
  char *local_1b0;
  reference local_1a8;
  Entry *local_1a0;
  __normal_iterator<slang::Entry_*,_std::vector<slang::Entry,_std::allocator<slang::Entry>_>_>
  local_198;
  Profiler *local_190;
  native_handle_type local_188;
  undefined1 *local_180;
  undefined4 *local_178;
  undefined4 local_170 [4];
  undefined1 local_160 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  Profiler *local_120;
  int local_118 [4];
  char *local_108 [2];
  value<fmt::v11::context> *local_f8 [7];
  undefined8 local_c0;
  int *local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  value<fmt::v11::context> **local_90;
  char **local_88;
  int *local_80;
  char *local_78;
  undefined8 local_70;
  string *local_68;
  int local_5c;
  int *local_58;
  value<fmt::v11::context> *pvVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar3;
  char *pcVar4;
  char **ppcVar5;
  
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(in_register_00000034,__fd);
  local_120 = this;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  boost::unordered::
  unordered_flat_map<std::thread::id,_int,_slang::hash<std::thread::id,_void>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  ::unordered_flat_map(in_stack_fffffffffffffd70);
  local_170[0] = 0;
  local_180 = local_160;
  local_178 = local_170;
  local_188 = (native_handle_type)std::this_thread::get_id();
  write::anon_class_16_2_334a61d8::operator()
            ((anon_class_16_2_334a61d8 *)in_stack_fffffffffffffd90._M_str,in_stack_fffffffffffffda0)
  ;
  std::operator<<((ostream *)local_128,"{ \"traceEvents\": [\n");
  local_190 = this;
  local_198._M_current =
       (Entry *)std::vector<slang::Entry,_std::allocator<slang::Entry>_>::begin
                          ((vector<slang::Entry,_std::allocator<slang::Entry>_> *)
                           in_stack_fffffffffffffd48);
  local_1a0 = (Entry *)std::vector<slang::Entry,_std::allocator<slang::Entry>_>::end
                                 ((vector<slang::Entry,_std::allocator<slang::Entry>_> *)
                                  in_stack_fffffffffffffd48);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::Entry_*,_std::vector<slang::Entry,_std::allocator<slang::Entry>_>_>
                      ((__normal_iterator<slang::Entry_*,_std::vector<slang::Entry,_std::allocator<slang::Entry>_>_>
                        *)in_stack_fffffffffffffd50,
                       (__normal_iterator<slang::Entry_*,_std::vector<slang::Entry,_std::allocator<slang::Entry>_>_>
                        *)in_stack_fffffffffffffd48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_1a8 = __gnu_cxx::
                __normal_iterator<slang::Entry_*,_std::vector<slang::Entry,_std::allocator<slang::Entry>_>_>
                ::operator*(&local_198);
    local_1c0 = (rep)std::chrono::operator-
                               ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                                (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)in_stack_fffffffffffffd50);
    local_1b8.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffd48);
    local_1b0 = (char *)std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_1b8);
    local_1d0.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffd48);
    this_00 = (value<fmt::v11::context> *)
              std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_1d0);
    local_200 = 
    "{{ \"pid\":1, \"tid\":{}, \"ph\":\"X\", \"ts\":{}, \"dur\":{}, \"name\":\"{}\", \"args\":{{ \"detail\":\"{}\" }} }},\n"
    ;
    local_1f8 = 0x5f;
    local_210 = (local_1a8->threadId)._M_thread;
    in_stack_fffffffffffffd50 = local_128;
    local_1c8 = this_00;
    in_stack_fffffffffffffd5c =
         write::anon_class_16_2_334a61d8::operator()
                   ((anon_class_16_2_334a61d8 *)in_stack_fffffffffffffd90._M_str,
                    in_stack_fffffffffffffda0);
    local_204 = in_stack_fffffffffffffd5c;
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd50);
    escapeString_abi_cxx11_(in_stack_fffffffffffffd90);
    in_stack_fffffffffffffd90 =
         std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd50);
    escapeString_abi_cxx11_(in_stack_fffffffffffffd90);
    local_68 = local_1f0;
    local_78 = local_200;
    local_70 = local_1f8;
    local_80 = &local_204;
    local_88 = &local_1b0;
    local_90 = &local_1c8;
    local_98 = local_230;
    local_a0 = &stack0xfffffffffffffda0;
    local_b0 = local_200;
    local_a8 = local_1f8;
    local_5c = local_204;
    local_58 = local_118;
    local_118[0] = local_204;
    ppcVar5 = local_108;
    local_108[0] = local_1b0;
    aVar3.values_ = (value<fmt::v11::context> *)local_f8;
    local_f8[0] = local_1c8;
    pvVar2 = local_1c8;
    pcVar4 = local_1b0;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    local_b8 = local_118;
    local_c0 = 0xdd331;
    fmt.size_ = (size_t)ppcVar5;
    fmt.data_ = pcVar4;
    args.field_1.values_ = aVar3.values_;
    args.desc_ = (unsigned_long_long)pvVar2;
    ::fmt::v11::vformat_abi_cxx11_(fmt,args);
    std::operator<<((ostream *)in_stack_fffffffffffffd50,local_1f0);
    std::__cxx11::string::~string(in_stack_fffffffffffffd50);
    std::__cxx11::string::~string(in_stack_fffffffffffffd50);
    std::__cxx11::string::~string(in_stack_fffffffffffffd50);
    __gnu_cxx::
    __normal_iterator<slang::Entry_*,_std::vector<slang::Entry,_std::allocator<slang::Entry>_>_>::
    operator++(&local_198);
  }
  std::operator<<((ostream *)local_128,
                  "{ \"cat\":\"\", \"pid\":1, \"tid\":0, \"ts\":0, \"ph\":\"M\", \"name\":\"process_name\", \"args\":{ \"name\":\"slang\" } }\n"
                 );
  std::operator<<((ostream *)local_128,"] }\n");
  boost::unordered::
  unordered_flat_map<std::thread::id,_int,_slang::hash<std::thread::id,_void>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  ::~unordered_flat_map
            ((unordered_flat_map<std::thread::id,_int,_slang::hash<std::thread::id,_void>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
              *)0x6a5003);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x6a5010);
  return extraout_RAX;
}

Assistant:

void write(std::ostream& os) {
        SLANG_ASSERT(stack.empty());
        std::scoped_lock<std::mutex> lock(mut);

        // std::thread::id isn't convertible to an integer, so put it in
        // a table to generate nice ids for output.
        flat_hash_map<std::thread::id, int> threadIdMap;
        int nextThreadId = 0;
        auto getTID = [&](std::thread::id id) {
            auto [it, inserted] = threadIdMap.try_emplace(id, nextThreadId);
            if (inserted)
                ++nextThreadId;
            return it->second;
        };

        // Make sure this thread (presumably the main thread) has ID 0.
        getTID(std::this_thread::get_id());

        os << "{ \"traceEvents\": [\n";

        for (auto& entry : entries) {
            auto startUs = duration_cast<microseconds>(entry.start - startTime).count();
            auto durationUs = duration_cast<microseconds>(entry.duration).count();
            os << fmt::format("{{ \"pid\":1, \"tid\":{}, \"ph\":\"X\", \"ts\":{}, "
                              "\"dur\":{}, \"name\":\"{}\", \"args\":{{ \"detail\":\"{}\" }} }},\n",
                              getTID(entry.threadId), startUs, durationUs, escapeString(entry.name),
                              escapeString(entry.detail));
        }

        // Emit metadata event with process name.
        os << "{ \"cat\":\"\", \"pid\":1, \"tid\":0, \"ts\":0, \"ph\":\"M\", "
              "\"name\":\"process_name\", \"args\":{ \"name\":\"slang\" } }\n";
        os << "] }\n";
    }